

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O0

optional<KTXcubemapIncomplete> *
ktx::KVEntry::
load<ktx::CommandCompare::compareKVEntry(ktx::PrintDiff&,std::basic_string_view<char,std::char_traits<char>>const&,ktxKVListEntry*,ktxKVListEntry*)::KTXcubemapIncomplete>
          (ktxHashListEntry *entry)

{
  long in_RSI;
  optional<KTXcubemapIncomplete> *in_RDI;
  KTXcubemapIncomplete newEntry;
  optional<KTXcubemapIncomplete> *this;
  long local_20;
  undefined1 local_18 [8];
  long local_10;
  
  if (in_RSI != 0) {
    this = in_RDI;
    local_10 = in_RSI;
    CommandCompare::compareKVEntry::KTXcubemapIncomplete::KTXcubemapIncomplete
              ((KTXcubemapIncomplete *)in_RDI);
    ktxHashListEntry_GetValue(local_10,local_18,&local_20);
    if (local_20 != 0) {
      std::optional<KTXcubemapIncomplete>::optional<KTXcubemapIncomplete,_true>
                (this,(KTXcubemapIncomplete *)in_RDI);
    }
    in_RDI = this;
    CommandCompare::compareKVEntry::KTXcubemapIncomplete::~KTXcubemapIncomplete
              ((KTXcubemapIncomplete *)0x16769e);
    if (local_20 != 0) {
      return in_RDI;
    }
  }
  std::optional<KTXcubemapIncomplete>::optional((optional<KTXcubemapIncomplete> *)0x1676b5);
  return in_RDI;
}

Assistant:

static std::optional<T> load(ktxHashListEntry* entry) {
        if (entry) {
            T newEntry;
            ktxHashListEntry_GetValue(entry, &newEntry.valueLen, reinterpret_cast<void**>(&newEntry.value));
            if (newEntry.value)
                return std::optional<T>(std::move(newEntry));
        }
        return std::optional<T>();
    }